

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O2

void fio_ls_embd_push(fio_ls_embd_s *dest,fio_ls_embd_s *node)

{
  fio_ls_embd_s *pfVar1;
  
  if (node != (fio_ls_embd_s *)0x0 && dest != (fio_ls_embd_s *)0x0) {
    pfVar1 = dest->prev;
    node->prev = pfVar1;
    node->next = dest;
    pfVar1->next = node;
    dest->prev = node;
  }
  return;
}

Assistant:

FIO_FUNC inline void fio_ls_embd_push(fio_ls_embd_s *dest,
                                      fio_ls_embd_s *node) {
  if (!dest || !node)
    return;
  node->prev = dest->prev;
  node->next = dest;
  dest->prev->next = node;
  dest->prev = node;
}